

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

Kit_Graph_t * Kit_GraphCreateConst0(void)

{
  Kit_Graph_t *pKVar1;
  
  pKVar1 = (Kit_Graph_t *)malloc(0x20);
  pKVar1->fConst = 0;
  pKVar1->nLeaves = 0;
  pKVar1->nSize = 0;
  pKVar1->nCap = 0;
  pKVar1->pNodes = (Kit_Node_t *)0x0;
  *(undefined8 *)&pKVar1->eRoot = 0;
  pKVar1->fConst = 1;
  *(byte *)&pKVar1->eRoot = *(byte *)&pKVar1->eRoot | 1;
  return pKVar1;
}

Assistant:

Kit_Graph_t * Kit_GraphCreateConst0()   
{
    Kit_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Kit_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Kit_Graph_t) );
    pGraph->fConst = 1;
    pGraph->eRoot.fCompl = 1;
    return pGraph;
}